

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSender.h
# Opt level: O3

void __thiscall jaegertracing::ThriftSender::~ThriftSender(ThriftSender *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TProtocolFactory *pTVar1;
  Transport *pTVar2;
  int in_ESI;
  
  (this->super_Sender)._vptr_Sender = (_func_int **)&PTR__ThriftSender_002655d8;
  net::Socket::close(&((this->_transporter)._M_t.
                       super___uniq_ptr_impl<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_jaegertracing::utils::Transport_*,_std::default_delete<jaegertracing::utils::Transport>_>
                       .super__Head_base<0UL,_jaegertracing::utils::Transport_*,_false>._M_head_impl
                      )->_socket,in_ESI);
  this_00 = (this->_thriftBuffer).
            super___shared_ptr<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pTVar1 = (this->_protocolFactory)._M_t.
           super___uniq_ptr_impl<apache::thrift::protocol::TProtocolFactory,_std::default_delete<apache::thrift::protocol::TProtocolFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_apache::thrift::protocol::TProtocolFactory_*,_std::default_delete<apache::thrift::protocol::TProtocolFactory>_>
           .super__Head_base<0UL,_apache::thrift::protocol::TProtocolFactory_*,_false>._M_head_impl;
  if (pTVar1 != (TProtocolFactory *)0x0) {
    (*pTVar1->_vptr_TProtocolFactory[1])();
  }
  (this->_protocolFactory)._M_t.
  super___uniq_ptr_impl<apache::thrift::protocol::TProtocolFactory,_std::default_delete<apache::thrift::protocol::TProtocolFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_apache::thrift::protocol::TProtocolFactory_*,_std::default_delete<apache::thrift::protocol::TProtocolFactory>_>
  .super__Head_base<0UL,_apache::thrift::protocol::TProtocolFactory_*,_false>._M_head_impl =
       (TProtocolFactory *)0x0;
  thrift::Process::~Process(&this->_process);
  std::vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_>::~vector
            (&this->_spanBuffer);
  pTVar2 = (this->_transporter)._M_t.
           super___uniq_ptr_impl<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::utils::Transport_*,_std::default_delete<jaegertracing::utils::Transport>_>
           .super__Head_base<0UL,_jaegertracing::utils::Transport_*,_false>._M_head_impl;
  if (pTVar2 != (Transport *)0x0) {
    (*pTVar2->_vptr_Transport[1])();
  }
  (this->_transporter)._M_t.
  super___uniq_ptr_impl<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::utils::Transport_*,_std::default_delete<jaegertracing::utils::Transport>_>
  .super__Head_base<0UL,_jaegertracing::utils::Transport_*,_false>._M_head_impl = (Transport *)0x0;
  return;
}

Assistant:

~ThriftSender() { close(); }